

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_net.cpp
# Opt level: O0

int NetbufferSize(void)

{
  BYTE *local_20;
  BYTE *skipper;
  int numtics;
  int count;
  int k;
  
  if ((doomcom.data[0] & 0xa0) == 0) {
    numtics = 2;
    if ((doomcom.data[0] & 0x40) != 0) {
      numtics = 3;
    }
    if ((NetMode == '\x01') && ((int)doomcom.remotenode == nodeforplayer[Net_Arbitrator])) {
      numtics = numtics + 1;
    }
    skipper._0_4_ = doomcom.data[0] & 3;
    if ((uint)skipper == 3) {
      skipper._0_4_ = doomcom.data[numtics] + 3;
      numtics = numtics + 1;
    }
    if ((doomcom.data[0] & 8) != 0) {
      numtics = doomcom.data[numtics] + 1 + numtics;
    }
    numtics = numtics + 1;
    if ((doomcom.data[0] & 0x10) == 0) {
      skipper._4_4_ = 1;
    }
    else {
      skipper._4_4_ = (uint)doomcom.data[numtics];
      numtics = skipper._4_4_ + numtics;
    }
    if ((int)doomcom.datalength < (int)(numtics + skipper._4_4_ * 3 * (uint)skipper)) {
      count = numtics + skipper._4_4_ * 3 * (uint)skipper;
    }
    else {
      local_20 = doomcom.data + numtics;
      if ((doomcom.data[0] & 0x80) == 0) {
        while (0 < (int)skipper._4_4_) {
          skipper._4_4_ = skipper._4_4_ - 1;
          SkipTicCmd(&local_20,(uint)skipper);
        }
      }
      count = (int)local_20 + -0xd54f74;
    }
  }
  else {
    count = (int)doomcom.datalength;
  }
  return count;
}

Assistant:

int NetbufferSize ()
{
	if (netbuffer[0] & (NCMD_EXIT | NCMD_SETUP))
	{
		return doomcom.datalength;
	}

	int k = 2, count, numtics;

	if (netbuffer[0] & NCMD_RETRANSMIT)
		k++;

	if (NetMode == NET_PacketServer && doomcom.remotenode == nodeforplayer[Net_Arbitrator])
		k++;

	numtics = netbuffer[0] & NCMD_XTICS;
	if (numtics == 3)
	{
		numtics += netbuffer[k++];
	}

	if (netbuffer[0] & NCMD_QUITTERS)
	{
		k += netbuffer[k] + 1;
	}

	// Network delay byte
	k++;

	if (netbuffer[0] & NCMD_MULTI)
	{
		count = netbuffer[k];
		k += count;
	}
	else
	{
		count = 1;
	}

	// Need at least 3 bytes per tic per player
	if (doomcom.datalength < k + 3 * count * numtics)
	{
		return k + 3 * count * numtics;
	}

	BYTE *skipper = &netbuffer[k];
	if ((netbuffer[0] & NCMD_EXIT) == 0)
	{
		while (count-- > 0)
		{
			SkipTicCmd (&skipper, numtics);
		}
	}
	return int(skipper - netbuffer);
}